

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arcflow.cpp
# Opt level: O0

void __thiscall Arcflow::finalize(Arcflow *this)

{
  initializer_list<int> __l;
  vector<int,_std::allocator<int>_> *u_00;
  bool bVar1;
  int iVar2;
  int iVar3;
  runtime_error *this_00;
  reference pvVar4;
  iterator __first;
  iterator __last;
  reference pvVar5;
  reference pvVar6;
  reference piVar7;
  reference _v;
  size_type sVar8;
  reference pAVar9;
  reference pvVar10;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *pvVar11;
  reference rVar12;
  Arc *a;
  iterator __end1;
  iterator __begin1;
  vector<Arc,_std::allocator<Arc>_> *__range1;
  reference local_370;
  int local_35c;
  iterator iStack_358;
  int t2_4;
  iterator __end3_2;
  iterator __begin3_2;
  value_type *__range3_2;
  _Bit_type local_338;
  int local_32c;
  iterator iStack_328;
  int t3;
  iterator __end5_1;
  iterator __begin5_1;
  value_type *__range5_1;
  _Bit_type local_308;
  int local_2fc;
  iterator iStack_2f8;
  int t2_3;
  iterator __end3_1;
  iterator __begin3_1;
  value_type *__range3_1;
  _Bit_type local_2d8;
  int local_2cc;
  iterator iStack_2c8;
  int t2_2;
  iterator __end3;
  iterator __begin3;
  value_type *__range3;
  int local_2a8;
  int t1_2;
  reference local_298;
  int local_284;
  undefined1 auStack_280 [4];
  int t_1;
  _Bit_type local_278;
  int local_26c;
  iterator iStack_268;
  int t2_1;
  iterator __end5;
  iterator __begin5;
  value_type *__range5;
  _Bit_type local_248;
  int local_23c;
  undefined1 auStack_238 [4];
  int t1_1;
  _Bit_type local_230;
  int local_224;
  undefined1 local_220 [4];
  int t;
  vector<int,_std::allocator<int>_> *local_208;
  vector<int,_std::allocator<int>_> *u;
  int i_4;
  vector<bool,_std::allocator<bool>_> valid_tgts;
  int local_1c8;
  int t2;
  int t1;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  bigger_than;
  int local_198;
  int local_194;
  int i_3;
  int i_2;
  value_type local_174;
  undefined1 local_170 [4];
  int i_1;
  vector<int,_std::allocator<int>_> torder;
  int local_14c;
  int i;
  int local_13c;
  iterator local_138;
  undefined8 local_130;
  char local_118 [8];
  char _error_msg_ [256];
  Arcflow *this_local;
  
  if ((this->ready & 1U) != 0) {
    snprintf(local_118,0x100,"AssertionError: assertion `%s` failed in \"%s\" line %d",
             "ready == false",
             "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/arcflow.cpp"
             ,0x1b9);
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,local_118);
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if ((this->inst).nbtypes == 1) {
    this->S = 0;
    local_13c = NodeSet::size(&this->NS);
    local_138 = &local_13c;
    local_130 = 1;
    __l._M_len = 1;
    __l._M_array = local_138;
    std::vector<int,_std::allocator<int>_>::assign(&this->Ts,__l);
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&this->Ts,0);
    Arc::Arc((Arc *)&stack0xfffffffffffffeb8,pvVar4,&this->S,this->LOSS);
    std::vector<Arc,_std::allocator<Arc>_>::push_back
              (&this->A,(value_type *)&stack0xfffffffffffffeb8);
    local_14c = 1;
    while( true ) {
      iVar3 = local_14c;
      iVar2 = NodeSet::size(&this->NS);
      if (iVar2 <= iVar3) break;
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&this->Ts,0);
      Arc::Arc((Arc *)&torder.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage,&local_14c,pvVar4,this->LOSS);
      std::vector<Arc,_std::allocator<Arc>_>::push_back
                (&this->A,(value_type *)
                          &torder.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage);
      local_14c = local_14c + 1;
    }
  }
  else {
    this->S = 0;
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)local_170);
    for (local_174 = 0; local_174 < (this->inst).nbtypes; local_174 = local_174 + 1) {
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)local_170,&local_174);
    }
    __first = std::vector<int,_std::allocator<int>_>::begin
                        ((vector<int,_std::allocator<int>_> *)local_170);
    __last = std::vector<int,_std::allocator<int>_>::end
                       ((vector<int,_std::allocator<int>_> *)local_170);
    std::
    sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,Arcflow::finalize()::__0>
              ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)__first._M_current
               ,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)__last._M_current
               ,(anon_class_8_1_8991fb9c)this);
    std::vector<int,_std::allocator<int>_>::resize(&this->Ts,(long)(this->inst).nbtypes);
    for (local_194 = 0; local_194 < (this->inst).nbtypes; local_194 = local_194 + 1) {
      iVar3 = NodeSet::size(&this->NS);
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)local_170,(long)local_194);
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&this->Ts,(long)*pvVar4);
      *pvVar4 = iVar3 + local_194;
    }
    for (local_198 = 0; local_198 < (this->inst).nbtypes; local_198 = local_198 + 1) {
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&this->Ts,(long)local_198);
      Arc::Arc((Arc *)((long)&bigger_than.
                              super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage + 4),pvVar4,
               &this->S,this->LOSS);
      std::vector<Arc,_std::allocator<Arc>_>::push_back
                (&this->A,(value_type *)
                          ((long)&bigger_than.
                                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
    }
    iVar3 = (this->inst).nbtypes;
    std::allocator<std::vector<int,_std::allocator<int>_>_>::allocator
              ((allocator<std::vector<int,_std::allocator<int>_>_> *)((long)&t2 + 3));
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              *)&t1,(long)iVar3,
             (allocator<std::vector<int,_std::allocator<int>_>_> *)((long)&t2 + 3));
    std::allocator<std::vector<int,_std::allocator<int>_>_>::~allocator
              ((allocator<std::vector<int,_std::allocator<int>_>_> *)((long)&t2 + 3));
    for (local_1c8 = 0; local_1c8 < (this->inst).nbtypes; local_1c8 = local_1c8 + 1) {
      for (valid_tgts.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_end_of_storage._4_4_ = 0;
          valid_tgts.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_end_of_storage._4_4_ < (this->inst).nbtypes;
          valid_tgts.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_end_of_storage._4_4_ =
               valid_tgts.super__Bvector_base<std::allocator<bool>_>._M_impl.
               super__Bvector_impl_data._M_end_of_storage._4_4_ + 1) {
        if (local_1c8 !=
            valid_tgts.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_end_of_storage._4_4_) {
          pvVar5 = std::
                   vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ::operator[](&(this->inst).Ws,(long)local_1c8);
          pvVar6 = std::
                   vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ::operator[](&(this->inst).Ws,
                                (long)valid_tgts.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                      super__Bvector_impl_data._M_end_of_storage._4_4_);
          bVar1 = is_valid(this,pvVar5,pvVar6);
          if (bVar1) {
            pvVar11 = &(this->inst).Ws;
            pvVar5 = std::
                     vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ::operator[](pvVar11,(long)local_1c8);
            pvVar6 = std::
                     vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ::operator[](pvVar11,(long)valid_tgts.
                                                super__Bvector_base<std::allocator<bool>_>._M_impl.
                                                super__Bvector_impl_data._M_end_of_storage._4_4_);
            bVar1 = std::operator!=(pvVar5,pvVar6);
            if (bVar1) {
LAB_001154b3:
              pvVar5 = std::
                       vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                       ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                     *)&t1,(long)local_1c8);
              std::vector<int,_std::allocator<int>_>::push_back
                        (pvVar5,(value_type *)
                                ((long)&valid_tgts.super__Bvector_base<std::allocator<bool>_>.
                                        _M_impl.super__Bvector_impl_data._M_end_of_storage + 4));
            }
            else if (local_1c8 <
                     valid_tgts.super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_end_of_storage._4_4_) {
              pvVar11 = &(this->inst).Ws;
              pvVar5 = std::
                       vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                       ::operator[](pvVar11,(long)local_1c8);
              pvVar6 = std::
                       vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                       ::operator[](pvVar11,(long)valid_tgts.
                                                  super__Bvector_base<std::allocator<bool>_>._M_impl
                                                  .super__Bvector_impl_data._M_end_of_storage._4_4_)
              ;
              bVar1 = std::operator==(pvVar5,pvVar6);
              if (bVar1) goto LAB_001154b3;
            }
          }
        }
      }
    }
    iVar3 = (this->inst).nbtypes;
    std::allocator<bool>::allocator((allocator<bool> *)((long)&u + 7));
    std::vector<bool,_std::allocator<bool>_>::vector
              ((vector<bool,_std::allocator<bool>_> *)&i_4,(long)iVar3,
               (allocator<bool> *)((long)&u + 7));
    std::allocator<bool>::~allocator((allocator<bool> *)((long)&u + 7));
    u._0_4_ = 1;
    while( true ) {
      iVar3 = (int)u;
      iVar2 = NodeSet::size(&this->NS);
      if (iVar2 <= iVar3) break;
      NodeSet::get_label((vector<int,_std::allocator<int>_> *)local_220,&this->NS,(int)u);
      local_208 = (vector<int,_std::allocator<int>_> *)local_220;
      for (local_224 = 0; u_00 = local_208, local_224 < (this->inst).nbtypes;
          local_224 = local_224 + 1) {
        pvVar5 = std::
                 vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ::operator[](&(this->inst).Ws,(long)local_224);
        bVar1 = is_valid(this,u_00,pvVar5);
        rVar12 = std::vector<bool,_std::allocator<bool>_>::operator[]
                           ((vector<bool,_std::allocator<bool>_> *)&i_4,(long)local_224);
        _auStack_238 = rVar12;
        std::_Bit_reference::operator=((_Bit_reference *)auStack_238,bVar1);
      }
      for (local_23c = 0; local_23c < (this->inst).nbtypes; local_23c = local_23c + 1) {
        rVar12 = std::vector<bool,_std::allocator<bool>_>::operator[]
                           ((vector<bool,_std::allocator<bool>_> *)&i_4,(long)local_23c);
        local_248 = rVar12._M_mask;
        __range5 = (value_type *)rVar12._M_p;
        bVar1 = std::_Bit_reference::operator_cast_to_bool((_Bit_reference *)&__range5);
        if (bVar1) {
          pvVar5 = std::
                   vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                 *)&t1,(long)local_23c);
          __end5 = std::vector<int,_std::allocator<int>_>::begin(pvVar5);
          iStack_268 = std::vector<int,_std::allocator<int>_>::end(pvVar5);
          while( true ) {
            bVar1 = __gnu_cxx::operator!=(&__end5,&stack0xfffffffffffffd98);
            if (!bVar1) break;
            piVar7 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                     operator*(&__end5);
            local_26c = *piVar7;
            rVar12 = std::vector<bool,_std::allocator<bool>_>::operator[]
                               ((vector<bool,_std::allocator<bool>_> *)&i_4,(long)local_26c);
            _auStack_280 = rVar12;
            std::_Bit_reference::operator=((_Bit_reference *)auStack_280,false);
            __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                      (&__end5);
          }
        }
      }
      for (local_284 = 0; local_284 < (this->inst).nbtypes; local_284 = local_284 + 1) {
        rVar12 = std::vector<bool,_std::allocator<bool>_>::operator[]
                           ((vector<bool,_std::allocator<bool>_> *)&i_4,(long)local_284);
        local_298 = rVar12;
        bVar1 = std::_Bit_reference::operator_cast_to_bool(&local_298);
        if (bVar1) {
          pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&this->Ts,(long)local_284);
          Arc::Arc((Arc *)&stack0xfffffffffffffd5c,(int *)&u,pvVar4,this->LOSS);
          std::vector<Arc,_std::allocator<Arc>_>::push_back
                    (&this->A,(value_type *)&stack0xfffffffffffffd5c);
        }
      }
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)local_220);
      u._0_4_ = (int)u + 1;
    }
    for (local_2a8 = 0; local_2a8 < (this->inst).nbtypes; local_2a8 = local_2a8 + 1) {
      __range3._7_1_ = 0;
      std::vector<bool,_std::allocator<bool>_>::assign
                ((vector<bool,_std::allocator<bool>_> *)&i_4,(long)(this->inst).nbtypes,
                 (bool *)((long)&__range3 + 7));
      pvVar5 = std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                             *)&t1,(long)local_2a8);
      __end3 = std::vector<int,_std::allocator<int>_>::begin(pvVar5);
      iStack_2c8 = std::vector<int,_std::allocator<int>_>::end(pvVar5);
      while( true ) {
        bVar1 = __gnu_cxx::operator!=(&__end3,&stack0xfffffffffffffd38);
        if (!bVar1) break;
        piVar7 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                 operator*(&__end3);
        local_2cc = *piVar7;
        rVar12 = std::vector<bool,_std::allocator<bool>_>::operator[]
                           ((vector<bool,_std::allocator<bool>_> *)&i_4,(long)local_2cc);
        local_2d8 = rVar12._M_mask;
        __range3_1 = (value_type *)rVar12._M_p;
        std::_Bit_reference::operator=((_Bit_reference *)&__range3_1,true);
        __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                  (&__end3);
      }
      pvVar5 = std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                             *)&t1,(long)local_2a8);
      __end3_1 = std::vector<int,_std::allocator<int>_>::begin(pvVar5);
      iStack_2f8 = std::vector<int,_std::allocator<int>_>::end(pvVar5);
      while( true ) {
        bVar1 = __gnu_cxx::operator!=(&__end3_1,&stack0xfffffffffffffd08);
        if (!bVar1) break;
        piVar7 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                 operator*(&__end3_1);
        local_2fc = *piVar7;
        rVar12 = std::vector<bool,_std::allocator<bool>_>::operator[]
                           ((vector<bool,_std::allocator<bool>_> *)&i_4,(long)local_2fc);
        local_308 = rVar12._M_mask;
        __range5_1 = (value_type *)rVar12._M_p;
        bVar1 = std::_Bit_reference::operator_cast_to_bool((_Bit_reference *)&__range5_1);
        if (bVar1) {
          pvVar5 = std::
                   vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                 *)&t1,(long)local_2fc);
          __end5_1 = std::vector<int,_std::allocator<int>_>::begin(pvVar5);
          iStack_328 = std::vector<int,_std::allocator<int>_>::end(pvVar5);
          while( true ) {
            bVar1 = __gnu_cxx::operator!=(&__end5_1,&stack0xfffffffffffffcd8);
            if (!bVar1) break;
            piVar7 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                     operator*(&__end5_1);
            local_32c = *piVar7;
            rVar12 = std::vector<bool,_std::allocator<bool>_>::operator[]
                               ((vector<bool,_std::allocator<bool>_> *)&i_4,(long)local_32c);
            local_338 = rVar12._M_mask;
            __range3_2 = (value_type *)rVar12._M_p;
            std::_Bit_reference::operator=((_Bit_reference *)&__range3_2,false);
            __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                      (&__end5_1);
          }
        }
        __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                  (&__end3_1);
      }
      pvVar5 = std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                             *)&t1,(long)local_2a8);
      __end3_2 = std::vector<int,_std::allocator<int>_>::begin(pvVar5);
      iStack_358 = std::vector<int,_std::allocator<int>_>::end(pvVar5);
      while( true ) {
        bVar1 = __gnu_cxx::operator!=(&__end3_2,&stack0xfffffffffffffca8);
        if (!bVar1) break;
        piVar7 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                 operator*(&__end3_2);
        local_35c = *piVar7;
        rVar12 = std::vector<bool,_std::allocator<bool>_>::operator[]
                           ((vector<bool,_std::allocator<bool>_> *)&i_4,(long)local_35c);
        local_370 = rVar12;
        bVar1 = std::_Bit_reference::operator_cast_to_bool(&local_370);
        if (bVar1) {
          pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&this->Ts,(long)local_2a8);
          _v = std::vector<int,_std::allocator<int>_>::operator[](&this->Ts,(long)local_35c);
          Arc::Arc((Arc *)((long)&__range1 + 4),pvVar4,_v,this->LOSS);
          std::vector<Arc,_std::allocator<Arc>_>::push_back
                    (&this->A,(value_type *)((long)&__range1 + 4));
        }
        __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                  (&__end3_2);
      }
    }
    std::vector<bool,_std::allocator<bool>_>::~vector((vector<bool,_std::allocator<bool>_> *)&i_4);
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               *)&t1);
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_170);
  }
  reduce_redundancy(this);
  iVar3 = NodeSet::size(&this->NS);
  sVar8 = std::vector<int,_std::allocator<int>_>::size(&this->Ts);
  this->NV = iVar3 + (int)sVar8;
  sVar8 = std::vector<Arc,_std::allocator<Arc>_>::size(&this->A);
  this->NA = (int)sVar8;
  __end1 = std::vector<Arc,_std::allocator<Arc>_>::begin(&this->A);
  a = (Arc *)std::vector<Arc,_std::allocator<Arc>_>::end(&this->A);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<Arc_*,_std::vector<Arc,_std::allocator<Arc>_>_> *)
                               &a);
    if (!bVar1) break;
    pAVar9 = __gnu_cxx::__normal_iterator<Arc_*,_std::vector<Arc,_std::allocator<Arc>_>_>::operator*
                       (&__end1);
    if (pAVar9->label != this->LOSS) {
      pvVar10 = std::vector<Item,_std::allocator<Item>_>::operator[]
                          (&this->sitems,(long)pAVar9->label);
      pAVar9->label = pvVar10->id;
    }
    __gnu_cxx::__normal_iterator<Arc_*,_std::vector<Arc,_std::allocator<Arc>_>_>::operator++
              (&__end1);
  }
  this->ready = true;
  return;
}

Assistant:

void Arcflow::finalize() {
	throw_assert(ready == false);
	if (inst.nbtypes == 1) {
		S = 0;
		Ts.assign({NS.size()});
		A.push_back(Arc(Ts[0], S, LOSS));
		for (int i = 1; i < static_cast<int>(NS.size()); i++) {
			A.push_back(Arc(i, Ts[0], LOSS));
		}
	} else {
		S = 0;
		std::vector<int> torder;
		for (int i = 0; i < inst.nbtypes; i++) {
			torder.push_back(i);
		}
		sort(all(torder), [this](int a, int b) {
			return this->inst.Ws[a] < this->inst.Ws[b];
		});
		Ts.resize(inst.nbtypes);
		for (int i = 0; i < inst.nbtypes; i++) {
			Ts[torder[i]] = NS.size() + i;
		}
		for (int i = 0; i < inst.nbtypes; i++) {
			A.push_back(Arc(Ts[i], S, LOSS));
		}

		std::vector<std::vector<int>> bigger_than(inst.nbtypes);
		for (int t1 = 0; t1 < inst.nbtypes; t1++) {
			for (int t2 = 0; t2 < inst.nbtypes; t2++) {
				if (t1 != t2 && is_valid(inst.Ws[t1], inst.Ws[t2])) {
					if (inst.Ws[t1] != inst.Ws[t2] ||
						(t1 < t2 && inst.Ws[t1] == inst.Ws[t2])) {
						bigger_than[t1].push_back(t2);
					}
				}
			}
		}

		std::vector<bool> valid_tgts(inst.nbtypes);
		for (int i = 1; i < static_cast<int>(NS.size()); i++) {
			const std::vector<int> &u = NS.get_label(i);
			for (int t = 0; t < inst.nbtypes; t++) {
				valid_tgts[t] = is_valid(u, inst.Ws[t]);
			}
			for (int t1 = 0; t1 < inst.nbtypes; t1++) {
				if (valid_tgts[t1]) {
					for (int t2 : bigger_than[t1]) {
						valid_tgts[t2] = false;
					}
				}
			}
			for (int t = 0; t < inst.nbtypes; t++) {
				if (valid_tgts[t]) {
					A.push_back(Arc(i, Ts[t], LOSS));
				}
			}
		}

		for (int t1 = 0; t1 < inst.nbtypes; t1++) {
			valid_tgts.assign(inst.nbtypes, false);
			for (int t2 : bigger_than[t1]) {
				valid_tgts[t2] = true;
			}
			for (int t2 : bigger_than[t1]) {
				if (valid_tgts[t2]) {
					for (int t3 : bigger_than[t2]) {
						valid_tgts[t3] = false;
					}
				}
			}
			for (int t2 : bigger_than[t1]) {
				if (valid_tgts[t2]) {
					A.push_back(Arc(Ts[t1], Ts[t2], LOSS));
				}
			}
		}
	}
	reduce_redundancy();
	NV = NS.size() + Ts.size();
	NA = A.size();
	for (Arc &a : A) {
		if (a.label != LOSS) {
			a.label = sitems[a.label].id;
		}
	}
	ready = true;
}